

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpptrace.cpp
# Opt level: O0

void cpptrace::rethrow_and_wrap_if_needed(size_t skip)

{
  nested_exception *this;
  undefined1 auVar1 [12];
  exception *anon_var_0;
  raw_trace local_48;
  exception_ptr local_30;
  int local_24;
  undefined8 local_20;
  exception_ptr local_18;
  size_t local_10;
  size_t skip_local;
  
  local_10 = skip;
  std::current_exception();
  auVar1 = std::rethrow_exception((exception_ptr)&local_18);
  local_24 = auVar1._8_4_;
  local_20 = auVar1._0_8_;
  std::__exception_ptr::exception_ptr::~exception_ptr(&local_18);
  if (local_24 == 2) {
    __cxa_begin_catch(local_20);
    __cxa_rethrow();
    std::numeric_limits<unsigned_int>::max();
    return;
  }
  __cxa_begin_catch(local_20);
  this = (nested_exception *)__cxa_allocate_exception(0x70);
  std::current_exception();
  detail::get_raw_trace_and_absorb(&local_48,local_10 + 1);
  nested_exception::nested_exception(this,&local_30,&local_48);
  __cxa_throw(this,&nested_exception::typeinfo,nested_exception::~nested_exception);
}

Assistant:

CPPTRACE_FORCE_NO_INLINE
    void rethrow_and_wrap_if_needed(std::size_t skip) {
        try {
            std::rethrow_exception(std::current_exception());
        } catch(cpptrace::exception&) {
            throw; // already a cpptrace::exception
        } catch(...) {
            throw nested_exception(std::current_exception(), detail::get_raw_trace_and_absorb(skip + 1));
        }
    }